

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O0

void __thiscall
AviWriter::AviWriter
          (AviWriter *this,char *outputFileName,uint bufferSize,unsigned_short movieWidth,
          unsigned_short movieHeight,uint movieFPS)

{
  FILE *pFVar1;
  ostream *poVar2;
  uint movieFPS_local;
  unsigned_short movieHeight_local;
  unsigned_short movieWidth_local;
  uint bufferSize_local;
  char *outputFileName_local;
  AviWriter *this_local;
  
  this->fBufferSize = bufferSize;
  this->fMovieWidth = movieWidth;
  this->fMovieHeight = movieHeight;
  this->fMovieFPS = movieFPS;
  std::queue<AVIIndexRecord*,std::deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>>>::
  queue<std::deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>>,void>
            ((queue<AVIIndexRecord*,std::deque<AVIIndexRecord*,std::allocator<AVIIndexRecord*>>> *)
             &this->indexRecords);
  pFVar1 = fopen(outputFileName,"wb");
  this->fOutFid = (FILE *)pFVar1;
  if (this->fOutFid == (FILE *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unable to open file ");
    poVar2 = std::operator<<(poVar2,outputFileName);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  this->fNumSubsessions = 2;
  this->fNumBytesWritten = 0;
  this->fRIFFSizeValue = 0;
  this->fRIFFSizePosition = 0;
  this->fJunkNumber = 0;
  this->fMoviSizeValue = 0;
  this->fMoviSizePosition = 0;
  this->fAVIHMaxBytesPerSecondPosition = 0;
  this->fAVIHFrameCountPosition = 0;
  this->fVideoMaxBytesPerSecond = 0;
  this->fNumVideoFrames = 0;
  this->fPrevVideoPts = 0;
  this->fAVIScale = 0;
  this->fAVIRate = 0;
  this->fAVISize = 0;
  this->fAVISubsessionTag = 0;
  this->fAVICodecHandlerType = 0;
  this->fAudioMaxBytesPerSecond = 0;
  this->fNumAudioFrames = 0;
  this->fPrevAudioPts = 0;
  this->fAVISamplingFrequency = 0;
  this->fWAVCodecTag = 0;
  this->fVideoSTRHFrameCountPosition = 0;
  this->fAudioSTRHFrameCountPosition = 0;
  this->fNumAudioChannels = 0;
  addFileHeader_AVI(this);
  return;
}

Assistant:

AviWriter::AviWriter(const char *outputFileName, unsigned int bufferSize, unsigned short movieWidth,
                     unsigned short movieHeight, unsigned int movieFPS) :
    fBufferSize(bufferSize), fMovieWidth(movieWidth), fMovieHeight(movieHeight), fMovieFPS(movieFPS)
{
    fOutFid = fopen(outputFileName, "wb");

    if (fOutFid == NULL)
        std::cerr << "Unable to open file " << outputFileName << std::endl;

    fNumSubsessions = 2;

    fNumBytesWritten = 0;

    fRIFFSizePosition = fRIFFSizeValue = 0;
    fJunkNumber = 0;
    fMoviSizePosition = fMoviSizeValue = 0;
    fAVIHMaxBytesPerSecondPosition = 0;
    fAVIHFrameCountPosition = 0;
    fVideoMaxBytesPerSecond = 0;
    fNumVideoFrames = 0;
    fPrevVideoPts = 0;
    fAVIScale = 0;
    fAVIRate = 0;
    fAVISize = 0;
    fAVISubsessionTag = 0;
    fAVICodecHandlerType = 0;
    fAudioMaxBytesPerSecond = 0;
    fNumAudioFrames = 0;
    fPrevAudioPts = 0;
    fAVISamplingFrequency = 0;
    fWAVCodecTag = 0;
    fVideoSTRHFrameCountPosition = 0;
    fAudioSTRHFrameCountPosition = 0;
    fNumAudioChannels = 0;

    addFileHeader_AVI();
}